

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_kernel_c.h
# Opt level: O1

T * __thiscall
dlib::
queue_kernel_c<dlib::queue_kernel_1<dlib::directory,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::element(queue_kernel_c<dlib::queue_kernel_1<dlib::directory,_dlib::memory_manager_stateless_kernel_1<char>_>_>
          *this)

{
  int iVar1;
  ostream *poVar2;
  fatal_error *this_00;
  ostringstream dlib_o_out;
  string local_1b0;
  undefined1 local_190 [376];
  
  iVar1 = (*(this->
            super_queue_kernel_1<dlib::directory,_dlib::memory_manager_stateless_kernel_1<char>_>).
            super_enumerable<dlib::directory>._vptr_enumerable[4])();
  if ((char)iVar1 != '\0') {
    return &((this->
             super_queue_kernel_1<dlib::directory,_dlib::memory_manager_stateless_kernel_1<char>_>).
            current_element)->item;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\n\nError detected at line ",0x19);
  poVar2 = (ostream *)std::ostream::operator<<(local_190,0x9a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/gui_widgets/../gui_core/../threads/../queue/queue_kernel_c.h"
             ,0x89);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "virtual typename queue_base::type &dlib::queue_kernel_c<dlib::queue_kernel_1<dlib::directory>>::element() [queue_base = dlib::queue_kernel_1<dlib::directory>]"
             ,0x9e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"this->current_element_valid() == true",0x25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) =
       *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\tT& queue::element",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\n\tyou can\'t access the current element if it doesn\'t exist",
             0x3a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n\tthis: ",8);
  poVar2 = std::ostream::_M_insert<void_const*>(local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

typename queue_base::type& queue_kernel_c<queue_base>::
    element (
    ) 
    {
        // make sure requires clause is not broken
        DLIB_CASSERT(this->current_element_valid() == true,
            "\tT& queue::element"
            << "\n\tyou can't access the current element if it doesn't exist"
            << "\n\tthis: " << this
            );

        // call the real function
        return queue_base::element();
    }